

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

void cmFortranParser_RuleUndef(cmFortranParser *parser,char *macro)

{
  iterator iVar1;
  bool bVar2;
  _Self local_68 [3];
  allocator local_49;
  key_type local_48;
  _Base_ptr local_28;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  iterator match;
  char *macro_local;
  cmFortranParser *parser_local;
  
  if (parser->InPPFalseBranch == 0) {
    match._M_node = (_Base_ptr)macro;
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_Rb_tree_const_iterator(&local_20);
    iVar1._M_node = match._M_node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,(char *)iVar1._M_node,&local_49);
    local_28 = (_Base_ptr)
               std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::find(&parser->PPDefinitions,&local_48);
    local_20._M_node = local_28;
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&parser->PPDefinitions);
    bVar2 = std::operator!=(&local_20,local_68);
    if (bVar2) {
      std::
      set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::erase_abi_cxx11_((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&parser->PPDefinitions,(const_iterator)local_20._M_node);
    }
  }
  return;
}

Assistant:

void cmFortranParser_RuleUndef(cmFortranParser* parser, const char* macro)
{
  if (!parser->InPPFalseBranch) {
    std::set<std::string>::iterator match;
    match = parser->PPDefinitions.find(macro);
    if (match != parser->PPDefinitions.end()) {
      parser->PPDefinitions.erase(match);
    }
  }
}